

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType * duckdb::UnionType::GetMemberType(LogicalType *type,idx_t index)

{
  child_list_t<LogicalType> *this;
  const_reference pvVar1;
  
  this = StructType::GetChildTypes_abi_cxx11_(type);
  pvVar1 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
           ::get<true>(this,index + 1);
  return &pvVar1->second;
}

Assistant:

const LogicalType &UnionType::GetMemberType(const LogicalType &type, idx_t index) {
	auto &child_types = StructType::GetChildTypes(type);
	D_ASSERT(index < child_types.size());
	// skip the "tag" field
	return child_types[index + 1].second;
}